

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

S2Point * __thiscall S2Polygon::GetCentroid(S2Point *__return_storage_ptr__,S2Polygon *this)

{
  uint uVar1;
  pointer puVar2;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> this_00;
  int i;
  long lVar3;
  S2Point local_68;
  double local_48;
  double dStack_40;
  double local_38;
  
  __return_storage_ptr__->c_[2] = 0.0;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  for (lVar3 = 0;
      puVar2 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(this->loops_).
                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 3);
      lVar3 = lVar3 + 1) {
    this_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
    super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
         puVar2[lVar3]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
    uVar1 = *(int *)((long)this_00._M_t.
                           super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                           super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8);
    S2Loop::GetCentroid(&local_68,
                        (S2Loop *)
                        this_00._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                        super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl);
    dStack_40 = (double)(int)(-(uVar1 & 1) | 1);
    local_38 = local_68.c_[2] * dStack_40;
    local_48 = dStack_40 * local_68.c_[0];
    dStack_40 = dStack_40 * local_68.c_[1];
    util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
              (__return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Polygon::GetCentroid() const {
  S2Point centroid;
  for (int i = 0; i < num_loops(); ++i) {
    centroid += loop(i)->sign() * loop(i)->GetCentroid();
  }
  return centroid;
}